

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt __thiscall slang::SVInt::operator-(SVInt *this)

{
  undefined8 extraout_RDX;
  long in_RSI;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_RDI;
  SVInt SVar2;
  bool in_stack_ffffffffffffffaf;
  SVInt *in_stack_ffffffffffffffd0;
  SVInt *in_stack_ffffffffffffffd8;
  undefined1 local_20 [32];
  undefined8 uVar1;
  
  if ((*(byte *)(in_RSI + 0xd) & 1) == 0) {
    SVInt((SVInt *)in_RDI.pVal,(bitwidth_t)((ulong)in_RDI >> 0x20),(uint64_t)local_20,
          in_stack_ffffffffffffffaf);
    operator-(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    ~SVInt((SVInt *)in_RDI.pVal);
    uVar1 = extraout_RDX;
  }
  else {
    SVar2 = createFillX((bitwidth_t)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
    uVar1 = SVar2.super_SVIntStorage._8_8_;
  }
  SVar2.super_SVIntStorage.bitWidth = (int)uVar1;
  SVar2.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar1 >> 0x20);
  SVar2.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar1 >> 0x28);
  SVar2.super_SVIntStorage._14_2_ = (short)((ulong)uVar1 >> 0x30);
  SVar2.super_SVIntStorage.field_0.val = in_RDI.val;
  return (SVInt)SVar2.super_SVIntStorage;
}

Assistant:

SVInt SVInt::operator-() const {
    if (unknownFlag)
        return createFillX(bitWidth, signFlag);
    return SVInt(bitWidth, 0, signFlag) - *this;
}